

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-condvar.c
# Opt level: O3

void condvar_signal(worker_config_conflict *c,int *flag)

{
  uv_mutex_t *mutex;
  int *piVar1;
  uv_sem_t *sem;
  undefined8 *puVar2;
  int64_t eval_b;
  int64_t eval_a;
  undefined8 uStack_50;
  worker_config_conflict *pwStack_48;
  int local_28 [2];
  long local_20;
  
  piVar1 = local_28;
  uv_sem_wait(&c->sem_waiting);
  uv_mutex_lock(&c->mutex);
  local_20 = (long)*flag;
  local_28[0] = 0;
  local_28[1] = 0;
  if (local_20 == 0) {
    *flag = 1;
    if (c->use_broadcast == 0) {
      uv_cond_signal(&c->cond);
    }
    else {
      uv_cond_broadcast(&c->cond);
    }
    uv_mutex_unlock(&c->mutex);
    uv_sem_post(&c->sem_signaled);
    return;
  }
  sem = (uv_sem_t *)(local_28 + 2);
  condvar_signal_cold_1();
  mutex = (uv_mutex_t *)(sem + 2);
  pwStack_48 = c;
  uv_mutex_lock(mutex);
  uv_sem_post(sem);
  do {
    uv_cond_wait((uv_cond_t *)((long)sem + 0x68),mutex);
  } while (*piVar1 == 0);
  uStack_50 = 1;
  if (*piVar1 == 1) {
    uv_mutex_unlock(mutex);
    uv_sem_wait(sem + 1);
    return;
  }
  puVar2 = &uStack_50;
  condvar_wait_cold_1();
  (*(code *)puVar2[0x15])();
  (*(code *)puVar2[0x16])(puVar2,puVar2 + 0x14);
  return;
}

Assistant:

static void condvar_signal(worker_config* c, int* flag) {
  /* Wait until waiter holds mutex and is preparing to wait. */
  uv_sem_wait(&c->sem_waiting);

  /* Make sure waiter has begun waiting. */
  uv_mutex_lock(&c->mutex);

  /* Help waiter differentiate between spurious and legitimate wakeup. */
  ASSERT_OK(*flag);
  *flag = 1;

  if (c->use_broadcast)
    uv_cond_broadcast(&c->cond);
  else
    uv_cond_signal(&c->cond);

  uv_mutex_unlock(&c->mutex);

  /* Done signaling. */
  uv_sem_post(&c->sem_signaled);
}